

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitStringMeasure
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,
          StringMeasure *curr)

{
  Name breakTo;
  bool bVar1;
  Literal *pLVar2;
  element_type *peVar3;
  size_t sVar4;
  Literal local_c8;
  undefined1 local_b0 [8];
  shared_ptr<wasm::GCData> data;
  Literal value;
  undefined1 local_78 [8];
  Flow flow;
  StringMeasure *curr_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  
  if (*(int *)(curr + 0x10) == 1) {
    visit((Flow *)local_78,this,*(Expression **)(curr + 0x18));
    bVar1 = Flow::breaking((Flow *)local_78);
    if (bVar1) {
      Flow::Flow(__return_storage_ptr__,(Flow *)local_78);
    }
    else {
      pLVar2 = Flow::getSingleValue((Flow *)local_78);
      ::wasm::Literal::Literal
                ((Literal *)
                 &data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 pLVar2);
      ::wasm::Literal::getGCData();
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_b0);
      if (!bVar1) {
        (*this->_vptr_ExpressionRunner[2])(this,"null ref");
      }
      peVar3 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_b0);
      sVar4 = SmallVector<wasm::Literal,_1UL>::size
                        (&(peVar3->values).super_SmallVector<wasm::Literal,_1UL>);
      wasm::Literal::Literal(&local_c8,(int32_t)sVar4);
      Flow::Flow(__return_storage_ptr__,&local_c8);
      ::wasm::Literal::~Literal(&local_c8);
      std::shared_ptr<wasm::GCData>::~shared_ptr((shared_ptr<wasm::GCData> *)local_b0);
      ::wasm::Literal::~Literal
                ((Literal *)
                 &data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    Flow::~Flow((Flow *)local_78);
  }
  else {
    flow.breakTo.super_IString.str._M_str = NONCONSTANT_FLOW;
    breakTo.super_IString.str._M_str = _operator__;
    breakTo.super_IString.str._M_len = (size_t)NONCONSTANT_FLOW;
    Flow::Flow(__return_storage_ptr__,breakTo);
  }
  return __return_storage_ptr__;
}

Assistant:

Flow visitStringMeasure(StringMeasure* curr) {
    // For now we only support JS-style strings.
    if (curr->op != StringMeasureWTF16) {
      return Flow(NONCONSTANT_FLOW);
    }

    Flow flow = visit(curr->ref);
    if (flow.breaking()) {
      return flow;
    }
    auto value = flow.getSingleValue();
    auto data = value.getGCData();
    if (!data) {
      trap("null ref");
    }

    return Literal(int32_t(data->values.size()));
  }